

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::Resign(CommissionerSafe *this,ErrorHandler *aHandler)

{
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  CommissionerSafe *local_38;
  _Any_data local_30;
  code *local_20;
  undefined8 uStack_18;
  
  local_38 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_30,aHandler);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x28);
  *(CommissionerSafe **)local_58._M_unused._0_8_ = local_38;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x20) = uStack_18;
  if (local_20 != (code *)0x0) {
    *(void **)((long)local_58._M_unused._0_8_ + 8) = local_30._M_unused._M_object;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = local_30._8_8_;
    *(code **)((long)local_58._M_unused._0_8_ + 0x18) = local_20;
    local_20 = (code *)0x0;
    uStack_18 = 0;
  }
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:213:22)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:213:22)>
             ::_M_manager;
  PushAsyncRequest(this,(AsyncRequest *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerSafe::Resign(ErrorHandler aHandler)
{
    PushAsyncRequest([=]() { mImpl->Resign(aHandler); });
}